

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glwInitFunctions.cpp
# Opt level: O2

void glw::initGL31Core(Functions *gl,FunctionLoader *loader)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  undefined4 extraout_var_57;
  undefined4 extraout_var_58;
  undefined4 extraout_var_59;
  undefined4 extraout_var_60;
  undefined4 extraout_var_61;
  undefined4 extraout_var_62;
  undefined4 extraout_var_63;
  undefined4 extraout_var_64;
  undefined4 extraout_var_65;
  undefined4 extraout_var_66;
  undefined4 extraout_var_67;
  undefined4 extraout_var_68;
  undefined4 extraout_var_69;
  undefined4 extraout_var_70;
  undefined4 extraout_var_71;
  undefined4 extraout_var_72;
  undefined4 extraout_var_73;
  undefined4 extraout_var_74;
  undefined4 extraout_var_75;
  undefined4 extraout_var_76;
  undefined4 extraout_var_77;
  undefined4 extraout_var_78;
  undefined4 extraout_var_79;
  undefined4 extraout_var_80;
  undefined4 extraout_var_81;
  undefined4 extraout_var_82;
  undefined4 extraout_var_83;
  undefined4 extraout_var_84;
  undefined4 extraout_var_85;
  undefined4 extraout_var_86;
  undefined4 extraout_var_87;
  undefined4 extraout_var_88;
  undefined4 extraout_var_89;
  undefined4 extraout_var_90;
  undefined4 extraout_var_91;
  undefined4 extraout_var_92;
  undefined4 extraout_var_93;
  undefined4 extraout_var_94;
  undefined4 extraout_var_95;
  undefined4 extraout_var_96;
  undefined4 extraout_var_97;
  undefined4 extraout_var_98;
  undefined4 extraout_var_99;
  undefined4 extraout_var_x00100;
  undefined4 extraout_var_x00101;
  undefined4 extraout_var_x00102;
  undefined4 extraout_var_x00103;
  undefined4 extraout_var_x00104;
  undefined4 extraout_var_x00105;
  undefined4 extraout_var_x00106;
  undefined4 extraout_var_x00107;
  undefined4 extraout_var_x00108;
  undefined4 extraout_var_x00109;
  undefined4 extraout_var_x00110;
  undefined4 extraout_var_x00111;
  undefined4 extraout_var_x00112;
  undefined4 extraout_var_x00113;
  undefined4 extraout_var_x00114;
  undefined4 extraout_var_x00115;
  undefined4 extraout_var_x00116;
  undefined4 extraout_var_x00117;
  undefined4 extraout_var_x00118;
  undefined4 extraout_var_x00119;
  undefined4 extraout_var_x00120;
  undefined4 extraout_var_x00121;
  undefined4 extraout_var_x00122;
  undefined4 extraout_var_x00123;
  undefined4 extraout_var_x00124;
  undefined4 extraout_var_x00125;
  undefined4 extraout_var_x00126;
  undefined4 extraout_var_x00127;
  undefined4 extraout_var_x00128;
  undefined4 extraout_var_x00129;
  undefined4 extraout_var_x00130;
  undefined4 extraout_var_x00131;
  undefined4 extraout_var_x00132;
  undefined4 extraout_var_x00133;
  undefined4 extraout_var_x00134;
  undefined4 extraout_var_x00135;
  undefined4 extraout_var_x00136;
  undefined4 extraout_var_x00137;
  undefined4 extraout_var_x00138;
  undefined4 extraout_var_x00139;
  undefined4 extraout_var_x00140;
  undefined4 extraout_var_x00141;
  undefined4 extraout_var_x00142;
  undefined4 extraout_var_x00143;
  undefined4 extraout_var_x00144;
  undefined4 extraout_var_x00145;
  undefined4 extraout_var_x00146;
  undefined4 extraout_var_x00147;
  undefined4 extraout_var_x00148;
  undefined4 extraout_var_x00149;
  undefined4 extraout_var_x00150;
  undefined4 extraout_var_x00151;
  undefined4 extraout_var_x00152;
  undefined4 extraout_var_x00153;
  undefined4 extraout_var_x00154;
  undefined4 extraout_var_x00155;
  undefined4 extraout_var_x00156;
  undefined4 extraout_var_x00157;
  undefined4 extraout_var_x00158;
  undefined4 extraout_var_x00159;
  undefined4 extraout_var_x00160;
  undefined4 extraout_var_x00161;
  undefined4 extraout_var_x00162;
  undefined4 extraout_var_x00163;
  undefined4 extraout_var_x00164;
  undefined4 extraout_var_x00165;
  undefined4 extraout_var_x00166;
  undefined4 extraout_var_x00167;
  undefined4 extraout_var_x00168;
  undefined4 extraout_var_x00169;
  undefined4 extraout_var_x00170;
  undefined4 extraout_var_x00171;
  undefined4 extraout_var_x00172;
  undefined4 extraout_var_x00173;
  undefined4 extraout_var_x00174;
  undefined4 extraout_var_x00175;
  undefined4 extraout_var_x00176;
  undefined4 extraout_var_x00177;
  undefined4 extraout_var_x00178;
  undefined4 extraout_var_x00179;
  undefined4 extraout_var_x00180;
  undefined4 extraout_var_x00181;
  undefined4 extraout_var_x00182;
  undefined4 extraout_var_x00183;
  undefined4 extraout_var_x00184;
  undefined4 extraout_var_x00185;
  undefined4 extraout_var_x00186;
  undefined4 extraout_var_x00187;
  undefined4 extraout_var_x00188;
  undefined4 extraout_var_x00189;
  undefined4 extraout_var_x00190;
  undefined4 extraout_var_x00191;
  undefined4 extraout_var_x00192;
  undefined4 extraout_var_x00193;
  undefined4 extraout_var_x00194;
  undefined4 extraout_var_x00195;
  undefined4 extraout_var_x00196;
  undefined4 extraout_var_x00197;
  undefined4 extraout_var_x00198;
  undefined4 extraout_var_x00199;
  undefined4 extraout_var_x00200;
  undefined4 extraout_var_x00201;
  undefined4 extraout_var_x00202;
  undefined4 extraout_var_x00203;
  undefined4 extraout_var_x00204;
  undefined4 extraout_var_x00205;
  undefined4 extraout_var_x00206;
  undefined4 extraout_var_x00207;
  undefined4 extraout_var_x00208;
  undefined4 extraout_var_x00209;
  undefined4 extraout_var_x00210;
  undefined4 extraout_var_x00211;
  undefined4 extraout_var_x00212;
  undefined4 extraout_var_x00213;
  undefined4 extraout_var_x00214;
  undefined4 extraout_var_x00215;
  undefined4 extraout_var_x00216;
  undefined4 extraout_var_x00217;
  undefined4 extraout_var_x00218;
  undefined4 extraout_var_x00219;
  undefined4 extraout_var_x00220;
  undefined4 extraout_var_x00221;
  undefined4 extraout_var_x00222;
  undefined4 extraout_var_x00223;
  undefined4 extraout_var_x00224;
  undefined4 extraout_var_x00225;
  undefined4 extraout_var_x00226;
  undefined4 extraout_var_x00227;
  undefined4 extraout_var_x00228;
  undefined4 extraout_var_x00229;
  undefined4 extraout_var_x00230;
  undefined4 extraout_var_x00231;
  undefined4 extraout_var_x00232;
  undefined4 extraout_var_x00233;
  undefined4 extraout_var_x00234;
  undefined4 extraout_var_x00235;
  undefined4 extraout_var_x00236;
  undefined4 extraout_var_x00237;
  undefined4 extraout_var_x00238;
  undefined4 extraout_var_x00239;
  undefined4 extraout_var_x00240;
  undefined4 extraout_var_x00241;
  undefined4 extraout_var_x00242;
  undefined4 extraout_var_x00243;
  undefined4 extraout_var_x00244;
  undefined4 extraout_var_x00245;
  undefined4 extraout_var_x00246;
  undefined4 extraout_var_x00247;
  undefined4 extraout_var_x00248;
  undefined4 extraout_var_x00249;
  undefined4 extraout_var_x00250;
  undefined4 extraout_var_x00251;
  undefined4 extraout_var_x00252;
  undefined4 extraout_var_x00253;
  undefined4 extraout_var_x00254;
  undefined4 extraout_var_x00255;
  undefined4 extraout_var_x00256;
  undefined4 extraout_var_x00257;
  undefined4 extraout_var_x00258;
  undefined4 extraout_var_x00259;
  undefined4 extraout_var_x00260;
  undefined4 extraout_var_x00261;
  undefined4 extraout_var_x00262;
  undefined4 extraout_var_x00263;
  undefined4 extraout_var_x00264;
  undefined4 extraout_var_x00265;
  undefined4 extraout_var_x00266;
  undefined4 extraout_var_x00267;
  undefined4 extraout_var_x00268;
  undefined4 extraout_var_x00269;
  undefined4 extraout_var_x00270;
  undefined4 extraout_var_x00271;
  undefined4 extraout_var_x00272;
  undefined4 extraout_var_x00273;
  undefined4 extraout_var_x00274;
  undefined4 extraout_var_x00275;
  undefined4 extraout_var_x00276;
  undefined4 extraout_var_x00277;
  undefined4 extraout_var_x00278;
  undefined4 extraout_var_x00279;
  undefined4 extraout_var_x00280;
  undefined4 extraout_var_x00281;
  undefined4 extraout_var_x00282;
  undefined4 extraout_var_x00283;
  undefined4 extraout_var_x00284;
  undefined4 extraout_var_x00285;
  undefined4 extraout_var_x00286;
  undefined4 extraout_var_x00287;
  undefined4 extraout_var_x00288;
  undefined4 extraout_var_x00289;
  undefined4 extraout_var_x00290;
  undefined4 extraout_var_x00291;
  undefined4 extraout_var_x00292;
  undefined4 extraout_var_x00293;
  undefined4 extraout_var_x00294;
  undefined4 extraout_var_x00295;
  
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glActiveTexture");
  gl->activeTexture = (glActiveTextureFunc)CONCAT44(extraout_var,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glAttachShader");
  gl->attachShader = (glAttachShaderFunc)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBeginConditionalRender");
  gl->beginConditionalRender = (glBeginConditionalRenderFunc)CONCAT44(extraout_var_01,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBeginQuery");
  gl->beginQuery = (glBeginQueryFunc)CONCAT44(extraout_var_02,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBeginTransformFeedback");
  gl->beginTransformFeedback = (glBeginTransformFeedbackFunc)CONCAT44(extraout_var_03,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBindAttribLocation");
  gl->bindAttribLocation = (glBindAttribLocationFunc)CONCAT44(extraout_var_04,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBindBuffer");
  gl->bindBuffer = (glBindBufferFunc)CONCAT44(extraout_var_05,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBindBufferBase");
  gl->bindBufferBase = (glBindBufferBaseFunc)CONCAT44(extraout_var_06,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBindBufferRange");
  gl->bindBufferRange = (glBindBufferRangeFunc)CONCAT44(extraout_var_07,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBindFragDataLocation");
  gl->bindFragDataLocation = (glBindFragDataLocationFunc)CONCAT44(extraout_var_08,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBindFramebuffer");
  gl->bindFramebuffer = (glBindFramebufferFunc)CONCAT44(extraout_var_09,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBindRenderbuffer");
  gl->bindRenderbuffer = (glBindRenderbufferFunc)CONCAT44(extraout_var_10,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBindTexture");
  gl->bindTexture = (glBindTextureFunc)CONCAT44(extraout_var_11,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBindVertexArray");
  gl->bindVertexArray = (glBindVertexArrayFunc)CONCAT44(extraout_var_12,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBlendColor");
  gl->blendColor = (glBlendColorFunc)CONCAT44(extraout_var_13,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBlendEquation");
  gl->blendEquation = (glBlendEquationFunc)CONCAT44(extraout_var_14,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBlendEquationSeparate");
  gl->blendEquationSeparate = (glBlendEquationSeparateFunc)CONCAT44(extraout_var_15,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBlendFunc");
  gl->blendFunc = (glBlendFuncFunc)CONCAT44(extraout_var_16,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBlendFuncSeparate");
  gl->blendFuncSeparate = (glBlendFuncSeparateFunc)CONCAT44(extraout_var_17,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBlitFramebuffer");
  gl->blitFramebuffer = (glBlitFramebufferFunc)CONCAT44(extraout_var_18,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBufferData");
  gl->bufferData = (glBufferDataFunc)CONCAT44(extraout_var_19,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glBufferSubData");
  gl->bufferSubData = (glBufferSubDataFunc)CONCAT44(extraout_var_20,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCheckFramebufferStatus");
  gl->checkFramebufferStatus = (glCheckFramebufferStatusFunc)CONCAT44(extraout_var_21,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glClampColor");
  gl->clampColor = (glClampColorFunc)CONCAT44(extraout_var_22,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glClear");
  gl->clear = (glClearFunc)CONCAT44(extraout_var_23,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glClearBufferfi");
  gl->clearBufferfi = (glClearBufferfiFunc)CONCAT44(extraout_var_24,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glClearBufferfv");
  gl->clearBufferfv = (glClearBufferfvFunc)CONCAT44(extraout_var_25,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glClearBufferiv");
  gl->clearBufferiv = (glClearBufferivFunc)CONCAT44(extraout_var_26,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glClearBufferuiv");
  gl->clearBufferuiv = (glClearBufferuivFunc)CONCAT44(extraout_var_27,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glClearColor");
  gl->clearColor = (glClearColorFunc)CONCAT44(extraout_var_28,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glClearDepth");
  gl->clearDepth = (glClearDepthFunc)CONCAT44(extraout_var_29,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glClearStencil");
  gl->clearStencil = (glClearStencilFunc)CONCAT44(extraout_var_30,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glColorMask");
  gl->colorMask = (glColorMaskFunc)CONCAT44(extraout_var_31,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glColorMaski");
  gl->colorMaski = (glColorMaskiFunc)CONCAT44(extraout_var_32,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCompileShader");
  gl->compileShader = (glCompileShaderFunc)CONCAT44(extraout_var_33,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCompressedTexImage1D");
  gl->compressedTexImage1D = (glCompressedTexImage1DFunc)CONCAT44(extraout_var_34,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCompressedTexImage2D");
  gl->compressedTexImage2D = (glCompressedTexImage2DFunc)CONCAT44(extraout_var_35,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCompressedTexImage3D");
  gl->compressedTexImage3D = (glCompressedTexImage3DFunc)CONCAT44(extraout_var_36,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCompressedTexSubImage1D");
  gl->compressedTexSubImage1D = (glCompressedTexSubImage1DFunc)CONCAT44(extraout_var_37,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCompressedTexSubImage2D");
  gl->compressedTexSubImage2D = (glCompressedTexSubImage2DFunc)CONCAT44(extraout_var_38,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCompressedTexSubImage3D");
  gl->compressedTexSubImage3D = (glCompressedTexSubImage3DFunc)CONCAT44(extraout_var_39,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCopyBufferSubData");
  gl->copyBufferSubData = (glCopyBufferSubDataFunc)CONCAT44(extraout_var_40,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCopyTexImage1D");
  gl->copyTexImage1D = (glCopyTexImage1DFunc)CONCAT44(extraout_var_41,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCopyTexImage2D");
  gl->copyTexImage2D = (glCopyTexImage2DFunc)CONCAT44(extraout_var_42,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCopyTexSubImage1D");
  gl->copyTexSubImage1D = (glCopyTexSubImage1DFunc)CONCAT44(extraout_var_43,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCopyTexSubImage2D");
  gl->copyTexSubImage2D = (glCopyTexSubImage2DFunc)CONCAT44(extraout_var_44,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCopyTexSubImage3D");
  gl->copyTexSubImage3D = (glCopyTexSubImage3DFunc)CONCAT44(extraout_var_45,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCreateProgram");
  gl->createProgram = (glCreateProgramFunc)CONCAT44(extraout_var_46,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCreateShader");
  gl->createShader = (glCreateShaderFunc)CONCAT44(extraout_var_47,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glCullFace");
  gl->cullFace = (glCullFaceFunc)CONCAT44(extraout_var_48,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDeleteBuffers");
  gl->deleteBuffers = (glDeleteBuffersFunc)CONCAT44(extraout_var_49,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDeleteFramebuffers");
  gl->deleteFramebuffers = (glDeleteFramebuffersFunc)CONCAT44(extraout_var_50,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDeleteProgram");
  gl->deleteProgram = (glDeleteProgramFunc)CONCAT44(extraout_var_51,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDeleteQueries");
  gl->deleteQueries = (glDeleteQueriesFunc)CONCAT44(extraout_var_52,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDeleteRenderbuffers");
  gl->deleteRenderbuffers = (glDeleteRenderbuffersFunc)CONCAT44(extraout_var_53,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDeleteShader");
  gl->deleteShader = (glDeleteShaderFunc)CONCAT44(extraout_var_54,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDeleteTextures");
  gl->deleteTextures = (glDeleteTexturesFunc)CONCAT44(extraout_var_55,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDeleteVertexArrays");
  gl->deleteVertexArrays = (glDeleteVertexArraysFunc)CONCAT44(extraout_var_56,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDepthFunc");
  gl->depthFunc = (glDepthFuncFunc)CONCAT44(extraout_var_57,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDepthMask");
  gl->depthMask = (glDepthMaskFunc)CONCAT44(extraout_var_58,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDepthRange");
  gl->depthRange = (glDepthRangeFunc)CONCAT44(extraout_var_59,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDetachShader");
  gl->detachShader = (glDetachShaderFunc)CONCAT44(extraout_var_60,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDisable");
  gl->disable = (glDisableFunc)CONCAT44(extraout_var_61,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDisableVertexAttribArray");
  gl->disableVertexAttribArray = (glDisableVertexAttribArrayFunc)CONCAT44(extraout_var_62,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDisablei");
  gl->disablei = (glDisableiFunc)CONCAT44(extraout_var_63,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDrawArrays");
  gl->drawArrays = (glDrawArraysFunc)CONCAT44(extraout_var_64,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDrawArraysInstanced");
  gl->drawArraysInstanced = (glDrawArraysInstancedFunc)CONCAT44(extraout_var_65,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDrawBuffer");
  gl->drawBuffer = (glDrawBufferFunc)CONCAT44(extraout_var_66,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDrawBuffers");
  gl->drawBuffers = (glDrawBuffersFunc)CONCAT44(extraout_var_67,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDrawElements");
  gl->drawElements = (glDrawElementsFunc)CONCAT44(extraout_var_68,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDrawElementsInstanced");
  gl->drawElementsInstanced = (glDrawElementsInstancedFunc)CONCAT44(extraout_var_69,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glDrawRangeElements");
  gl->drawRangeElements = (glDrawRangeElementsFunc)CONCAT44(extraout_var_70,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glEnable");
  gl->enable = (glEnableFunc)CONCAT44(extraout_var_71,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glEnableVertexAttribArray");
  gl->enableVertexAttribArray = (glEnableVertexAttribArrayFunc)CONCAT44(extraout_var_72,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glEnablei");
  gl->enablei = (glEnableiFunc)CONCAT44(extraout_var_73,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glEndConditionalRender");
  gl->endConditionalRender = (glEndConditionalRenderFunc)CONCAT44(extraout_var_74,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glEndQuery");
  gl->endQuery = (glEndQueryFunc)CONCAT44(extraout_var_75,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glEndTransformFeedback");
  gl->endTransformFeedback = (glEndTransformFeedbackFunc)CONCAT44(extraout_var_76,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glFinish");
  gl->finish = (glFinishFunc)CONCAT44(extraout_var_77,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glFlush");
  gl->flush = (glFlushFunc)CONCAT44(extraout_var_78,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glFlushMappedBufferRange");
  gl->flushMappedBufferRange = (glFlushMappedBufferRangeFunc)CONCAT44(extraout_var_79,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glFramebufferRenderbuffer");
  gl->framebufferRenderbuffer = (glFramebufferRenderbufferFunc)CONCAT44(extraout_var_80,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glFramebufferTexture1D");
  gl->framebufferTexture1D = (glFramebufferTexture1DFunc)CONCAT44(extraout_var_81,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glFramebufferTexture2D");
  gl->framebufferTexture2D = (glFramebufferTexture2DFunc)CONCAT44(extraout_var_82,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glFramebufferTexture3D");
  gl->framebufferTexture3D = (glFramebufferTexture3DFunc)CONCAT44(extraout_var_83,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glFramebufferTextureLayer");
  gl->framebufferTextureLayer = (glFramebufferTextureLayerFunc)CONCAT44(extraout_var_84,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glFrontFace");
  gl->frontFace = (glFrontFaceFunc)CONCAT44(extraout_var_85,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGenBuffers");
  gl->genBuffers = (glGenBuffersFunc)CONCAT44(extraout_var_86,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGenFramebuffers");
  gl->genFramebuffers = (glGenFramebuffersFunc)CONCAT44(extraout_var_87,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGenQueries");
  gl->genQueries = (glGenQueriesFunc)CONCAT44(extraout_var_88,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGenRenderbuffers");
  gl->genRenderbuffers = (glGenRenderbuffersFunc)CONCAT44(extraout_var_89,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGenTextures");
  gl->genTextures = (glGenTexturesFunc)CONCAT44(extraout_var_90,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGenVertexArrays");
  gl->genVertexArrays = (glGenVertexArraysFunc)CONCAT44(extraout_var_91,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGenerateMipmap");
  gl->generateMipmap = (glGenerateMipmapFunc)CONCAT44(extraout_var_92,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetActiveAttrib");
  gl->getActiveAttrib = (glGetActiveAttribFunc)CONCAT44(extraout_var_93,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetActiveUniform");
  gl->getActiveUniform = (glGetActiveUniformFunc)CONCAT44(extraout_var_94,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetActiveUniformBlockName");
  gl->getActiveUniformBlockName = (glGetActiveUniformBlockNameFunc)CONCAT44(extraout_var_95,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetActiveUniformBlockiv");
  gl->getActiveUniformBlockiv = (glGetActiveUniformBlockivFunc)CONCAT44(extraout_var_96,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetActiveUniformName");
  gl->getActiveUniformName = (glGetActiveUniformNameFunc)CONCAT44(extraout_var_97,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetActiveUniformsiv");
  gl->getActiveUniformsiv = (glGetActiveUniformsivFunc)CONCAT44(extraout_var_98,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetAttachedShaders");
  gl->getAttachedShaders = (glGetAttachedShadersFunc)CONCAT44(extraout_var_99,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetAttribLocation");
  gl->getAttribLocation = (glGetAttribLocationFunc)CONCAT44(extraout_var_x00100,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetBooleani_v");
  gl->getBooleani_v = (glGetBooleani_vFunc)CONCAT44(extraout_var_x00101,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetBooleanv");
  gl->getBooleanv = (glGetBooleanvFunc)CONCAT44(extraout_var_x00102,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetBufferParameteriv");
  gl->getBufferParameteriv = (glGetBufferParameterivFunc)CONCAT44(extraout_var_x00103,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetBufferPointerv");
  gl->getBufferPointerv = (glGetBufferPointervFunc)CONCAT44(extraout_var_x00104,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetBufferSubData");
  gl->getBufferSubData = (glGetBufferSubDataFunc)CONCAT44(extraout_var_x00105,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetCompressedTexImage");
  gl->getCompressedTexImage = (glGetCompressedTexImageFunc)CONCAT44(extraout_var_x00106,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetDoublev");
  gl->getDoublev = (glGetDoublevFunc)CONCAT44(extraout_var_x00107,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetError");
  gl->getError = (glGetErrorFunc)CONCAT44(extraout_var_x00108,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetFloatv");
  gl->getFloatv = (glGetFloatvFunc)CONCAT44(extraout_var_x00109,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetFragDataLocation");
  gl->getFragDataLocation = (glGetFragDataLocationFunc)CONCAT44(extraout_var_x00110,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetFramebufferAttachmentParameteriv");
  gl->getFramebufferAttachmentParameteriv =
       (glGetFramebufferAttachmentParameterivFunc)CONCAT44(extraout_var_x00111,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetIntegeri_v");
  gl->getIntegeri_v = (glGetIntegeri_vFunc)CONCAT44(extraout_var_x00112,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetIntegerv");
  gl->getIntegerv = (glGetIntegervFunc)CONCAT44(extraout_var_x00113,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetProgramInfoLog");
  gl->getProgramInfoLog = (glGetProgramInfoLogFunc)CONCAT44(extraout_var_x00114,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetProgramiv");
  gl->getProgramiv = (glGetProgramivFunc)CONCAT44(extraout_var_x00115,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetQueryObjectiv");
  gl->getQueryObjectiv = (glGetQueryObjectivFunc)CONCAT44(extraout_var_x00116,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetQueryObjectuiv");
  gl->getQueryObjectuiv = (glGetQueryObjectuivFunc)CONCAT44(extraout_var_x00117,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetQueryiv");
  gl->getQueryiv = (glGetQueryivFunc)CONCAT44(extraout_var_x00118,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetRenderbufferParameteriv");
  gl->getRenderbufferParameteriv =
       (glGetRenderbufferParameterivFunc)CONCAT44(extraout_var_x00119,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetShaderInfoLog");
  gl->getShaderInfoLog = (glGetShaderInfoLogFunc)CONCAT44(extraout_var_x00120,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetShaderSource");
  gl->getShaderSource = (glGetShaderSourceFunc)CONCAT44(extraout_var_x00121,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetShaderiv");
  gl->getShaderiv = (glGetShaderivFunc)CONCAT44(extraout_var_x00122,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetString");
  gl->getString = (glGetStringFunc)CONCAT44(extraout_var_x00123,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetStringi");
  gl->getStringi = (glGetStringiFunc)CONCAT44(extraout_var_x00124,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetTexImage");
  gl->getTexImage = (glGetTexImageFunc)CONCAT44(extraout_var_x00125,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetTexLevelParameterfv");
  gl->getTexLevelParameterfv = (glGetTexLevelParameterfvFunc)CONCAT44(extraout_var_x00126,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetTexLevelParameteriv");
  gl->getTexLevelParameteriv = (glGetTexLevelParameterivFunc)CONCAT44(extraout_var_x00127,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetTexParameterIiv");
  gl->getTexParameterIiv = (glGetTexParameterIivFunc)CONCAT44(extraout_var_x00128,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetTexParameterIuiv");
  gl->getTexParameterIuiv = (glGetTexParameterIuivFunc)CONCAT44(extraout_var_x00129,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetTexParameterfv");
  gl->getTexParameterfv = (glGetTexParameterfvFunc)CONCAT44(extraout_var_x00130,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetTexParameteriv");
  gl->getTexParameteriv = (glGetTexParameterivFunc)CONCAT44(extraout_var_x00131,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetTransformFeedbackVarying");
  gl->getTransformFeedbackVarying =
       (glGetTransformFeedbackVaryingFunc)CONCAT44(extraout_var_x00132,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetUniformBlockIndex");
  gl->getUniformBlockIndex = (glGetUniformBlockIndexFunc)CONCAT44(extraout_var_x00133,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetUniformIndices");
  gl->getUniformIndices = (glGetUniformIndicesFunc)CONCAT44(extraout_var_x00134,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetUniformLocation");
  gl->getUniformLocation = (glGetUniformLocationFunc)CONCAT44(extraout_var_x00135,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetUniformfv");
  gl->getUniformfv = (glGetUniformfvFunc)CONCAT44(extraout_var_x00136,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetUniformiv");
  gl->getUniformiv = (glGetUniformivFunc)CONCAT44(extraout_var_x00137,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetUniformuiv");
  gl->getUniformuiv = (glGetUniformuivFunc)CONCAT44(extraout_var_x00138,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetVertexAttribIiv");
  gl->getVertexAttribIiv = (glGetVertexAttribIivFunc)CONCAT44(extraout_var_x00139,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetVertexAttribIuiv");
  gl->getVertexAttribIuiv = (glGetVertexAttribIuivFunc)CONCAT44(extraout_var_x00140,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetVertexAttribPointerv");
  gl->getVertexAttribPointerv = (glGetVertexAttribPointervFunc)CONCAT44(extraout_var_x00141,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetVertexAttribdv");
  gl->getVertexAttribdv = (glGetVertexAttribdvFunc)CONCAT44(extraout_var_x00142,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetVertexAttribfv");
  gl->getVertexAttribfv = (glGetVertexAttribfvFunc)CONCAT44(extraout_var_x00143,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glGetVertexAttribiv");
  gl->getVertexAttribiv = (glGetVertexAttribivFunc)CONCAT44(extraout_var_x00144,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glHint");
  gl->hint = (glHintFunc)CONCAT44(extraout_var_x00145,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glIsBuffer");
  gl->isBuffer = (glIsBufferFunc)CONCAT44(extraout_var_x00146,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glIsEnabled");
  gl->isEnabled = (glIsEnabledFunc)CONCAT44(extraout_var_x00147,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glIsEnabledi");
  gl->isEnabledi = (glIsEnablediFunc)CONCAT44(extraout_var_x00148,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glIsFramebuffer");
  gl->isFramebuffer = (glIsFramebufferFunc)CONCAT44(extraout_var_x00149,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glIsProgram");
  gl->isProgram = (glIsProgramFunc)CONCAT44(extraout_var_x00150,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glIsQuery");
  gl->isQuery = (glIsQueryFunc)CONCAT44(extraout_var_x00151,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glIsRenderbuffer");
  gl->isRenderbuffer = (glIsRenderbufferFunc)CONCAT44(extraout_var_x00152,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glIsShader");
  gl->isShader = (glIsShaderFunc)CONCAT44(extraout_var_x00153,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glIsTexture");
  gl->isTexture = (glIsTextureFunc)CONCAT44(extraout_var_x00154,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glIsVertexArray");
  gl->isVertexArray = (glIsVertexArrayFunc)CONCAT44(extraout_var_x00155,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glLineWidth");
  gl->lineWidth = (glLineWidthFunc)CONCAT44(extraout_var_x00156,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glLinkProgram");
  gl->linkProgram = (glLinkProgramFunc)CONCAT44(extraout_var_x00157,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glLogicOp");
  gl->logicOp = (glLogicOpFunc)CONCAT44(extraout_var_x00158,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glMapBuffer");
  gl->mapBuffer = (glMapBufferFunc)CONCAT44(extraout_var_x00159,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glMapBufferRange");
  gl->mapBufferRange = (glMapBufferRangeFunc)CONCAT44(extraout_var_x00160,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glMultiDrawArrays");
  gl->multiDrawArrays = (glMultiDrawArraysFunc)CONCAT44(extraout_var_x00161,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glMultiDrawElements");
  gl->multiDrawElements = (glMultiDrawElementsFunc)CONCAT44(extraout_var_x00162,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glPixelStoref");
  gl->pixelStoref = (glPixelStorefFunc)CONCAT44(extraout_var_x00163,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glPixelStorei");
  gl->pixelStorei = (glPixelStoreiFunc)CONCAT44(extraout_var_x00164,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glPointParameterf");
  gl->pointParameterf = (glPointParameterfFunc)CONCAT44(extraout_var_x00165,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glPointParameterfv");
  gl->pointParameterfv = (glPointParameterfvFunc)CONCAT44(extraout_var_x00166,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glPointParameteri");
  gl->pointParameteri = (glPointParameteriFunc)CONCAT44(extraout_var_x00167,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glPointParameteriv");
  gl->pointParameteriv = (glPointParameterivFunc)CONCAT44(extraout_var_x00168,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glPointSize");
  gl->pointSize = (glPointSizeFunc)CONCAT44(extraout_var_x00169,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glPolygonMode");
  gl->polygonMode = (glPolygonModeFunc)CONCAT44(extraout_var_x00170,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glPolygonOffset");
  gl->polygonOffset = (glPolygonOffsetFunc)CONCAT44(extraout_var_x00171,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glPrimitiveRestartIndex");
  gl->primitiveRestartIndex = (glPrimitiveRestartIndexFunc)CONCAT44(extraout_var_x00172,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glReadBuffer");
  gl->readBuffer = (glReadBufferFunc)CONCAT44(extraout_var_x00173,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glReadPixels");
  gl->readPixels = (glReadPixelsFunc)CONCAT44(extraout_var_x00174,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glRenderbufferStorage");
  gl->renderbufferStorage = (glRenderbufferStorageFunc)CONCAT44(extraout_var_x00175,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glRenderbufferStorageMultisample");
  gl->renderbufferStorageMultisample =
       (glRenderbufferStorageMultisampleFunc)CONCAT44(extraout_var_x00176,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glSampleCoverage");
  gl->sampleCoverage = (glSampleCoverageFunc)CONCAT44(extraout_var_x00177,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glScissor");
  gl->scissor = (glScissorFunc)CONCAT44(extraout_var_x00178,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glShaderSource");
  gl->shaderSource = (glShaderSourceFunc)CONCAT44(extraout_var_x00179,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glStencilFunc");
  gl->stencilFunc = (glStencilFuncFunc)CONCAT44(extraout_var_x00180,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glStencilFuncSeparate");
  gl->stencilFuncSeparate = (glStencilFuncSeparateFunc)CONCAT44(extraout_var_x00181,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glStencilMask");
  gl->stencilMask = (glStencilMaskFunc)CONCAT44(extraout_var_x00182,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glStencilMaskSeparate");
  gl->stencilMaskSeparate = (glStencilMaskSeparateFunc)CONCAT44(extraout_var_x00183,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glStencilOp");
  gl->stencilOp = (glStencilOpFunc)CONCAT44(extraout_var_x00184,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glStencilOpSeparate");
  gl->stencilOpSeparate = (glStencilOpSeparateFunc)CONCAT44(extraout_var_x00185,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTexBuffer");
  gl->texBuffer = (glTexBufferFunc)CONCAT44(extraout_var_x00186,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTexImage1D");
  gl->texImage1D = (glTexImage1DFunc)CONCAT44(extraout_var_x00187,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTexImage2D");
  gl->texImage2D = (glTexImage2DFunc)CONCAT44(extraout_var_x00188,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTexImage3D");
  gl->texImage3D = (glTexImage3DFunc)CONCAT44(extraout_var_x00189,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTexParameterIiv");
  gl->texParameterIiv = (glTexParameterIivFunc)CONCAT44(extraout_var_x00190,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTexParameterIuiv");
  gl->texParameterIuiv = (glTexParameterIuivFunc)CONCAT44(extraout_var_x00191,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTexParameterf");
  gl->texParameterf = (glTexParameterfFunc)CONCAT44(extraout_var_x00192,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTexParameterfv");
  gl->texParameterfv = (glTexParameterfvFunc)CONCAT44(extraout_var_x00193,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTexParameteri");
  gl->texParameteri = (glTexParameteriFunc)CONCAT44(extraout_var_x00194,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTexParameteriv");
  gl->texParameteriv = (glTexParameterivFunc)CONCAT44(extraout_var_x00195,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTexSubImage1D");
  gl->texSubImage1D = (glTexSubImage1DFunc)CONCAT44(extraout_var_x00196,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTexSubImage2D");
  gl->texSubImage2D = (glTexSubImage2DFunc)CONCAT44(extraout_var_x00197,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTexSubImage3D");
  gl->texSubImage3D = (glTexSubImage3DFunc)CONCAT44(extraout_var_x00198,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glTransformFeedbackVaryings");
  gl->transformFeedbackVaryings =
       (glTransformFeedbackVaryingsFunc)CONCAT44(extraout_var_x00199,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform1f");
  gl->uniform1f = (glUniform1fFunc)CONCAT44(extraout_var_x00200,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform1fv");
  gl->uniform1fv = (glUniform1fvFunc)CONCAT44(extraout_var_x00201,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform1i");
  gl->uniform1i = (glUniform1iFunc)CONCAT44(extraout_var_x00202,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform1iv");
  gl->uniform1iv = (glUniform1ivFunc)CONCAT44(extraout_var_x00203,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform1ui");
  gl->uniform1ui = (glUniform1uiFunc)CONCAT44(extraout_var_x00204,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform1uiv");
  gl->uniform1uiv = (glUniform1uivFunc)CONCAT44(extraout_var_x00205,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform2f");
  gl->uniform2f = (glUniform2fFunc)CONCAT44(extraout_var_x00206,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform2fv");
  gl->uniform2fv = (glUniform2fvFunc)CONCAT44(extraout_var_x00207,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform2i");
  gl->uniform2i = (glUniform2iFunc)CONCAT44(extraout_var_x00208,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform2iv");
  gl->uniform2iv = (glUniform2ivFunc)CONCAT44(extraout_var_x00209,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform2ui");
  gl->uniform2ui = (glUniform2uiFunc)CONCAT44(extraout_var_x00210,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform2uiv");
  gl->uniform2uiv = (glUniform2uivFunc)CONCAT44(extraout_var_x00211,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform3f");
  gl->uniform3f = (glUniform3fFunc)CONCAT44(extraout_var_x00212,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform3fv");
  gl->uniform3fv = (glUniform3fvFunc)CONCAT44(extraout_var_x00213,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform3i");
  gl->uniform3i = (glUniform3iFunc)CONCAT44(extraout_var_x00214,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform3iv");
  gl->uniform3iv = (glUniform3ivFunc)CONCAT44(extraout_var_x00215,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform3ui");
  gl->uniform3ui = (glUniform3uiFunc)CONCAT44(extraout_var_x00216,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform3uiv");
  gl->uniform3uiv = (glUniform3uivFunc)CONCAT44(extraout_var_x00217,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform4f");
  gl->uniform4f = (glUniform4fFunc)CONCAT44(extraout_var_x00218,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform4fv");
  gl->uniform4fv = (glUniform4fvFunc)CONCAT44(extraout_var_x00219,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform4i");
  gl->uniform4i = (glUniform4iFunc)CONCAT44(extraout_var_x00220,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform4iv");
  gl->uniform4iv = (glUniform4ivFunc)CONCAT44(extraout_var_x00221,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform4ui");
  gl->uniform4ui = (glUniform4uiFunc)CONCAT44(extraout_var_x00222,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniform4uiv");
  gl->uniform4uiv = (glUniform4uivFunc)CONCAT44(extraout_var_x00223,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniformBlockBinding");
  gl->uniformBlockBinding = (glUniformBlockBindingFunc)CONCAT44(extraout_var_x00224,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniformMatrix2fv");
  gl->uniformMatrix2fv = (glUniformMatrix2fvFunc)CONCAT44(extraout_var_x00225,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniformMatrix2x3fv");
  gl->uniformMatrix2x3fv = (glUniformMatrix2x3fvFunc)CONCAT44(extraout_var_x00226,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniformMatrix2x4fv");
  gl->uniformMatrix2x4fv = (glUniformMatrix2x4fvFunc)CONCAT44(extraout_var_x00227,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniformMatrix3fv");
  gl->uniformMatrix3fv = (glUniformMatrix3fvFunc)CONCAT44(extraout_var_x00228,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniformMatrix3x2fv");
  gl->uniformMatrix3x2fv = (glUniformMatrix3x2fvFunc)CONCAT44(extraout_var_x00229,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniformMatrix3x4fv");
  gl->uniformMatrix3x4fv = (glUniformMatrix3x4fvFunc)CONCAT44(extraout_var_x00230,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniformMatrix4fv");
  gl->uniformMatrix4fv = (glUniformMatrix4fvFunc)CONCAT44(extraout_var_x00231,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniformMatrix4x2fv");
  gl->uniformMatrix4x2fv = (glUniformMatrix4x2fvFunc)CONCAT44(extraout_var_x00232,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUniformMatrix4x3fv");
  gl->uniformMatrix4x3fv = (glUniformMatrix4x3fvFunc)CONCAT44(extraout_var_x00233,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUnmapBuffer");
  gl->unmapBuffer = (glUnmapBufferFunc)CONCAT44(extraout_var_x00234,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glUseProgram");
  gl->useProgram = (glUseProgramFunc)CONCAT44(extraout_var_x00235,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glValidateProgram");
  gl->validateProgram = (glValidateProgramFunc)CONCAT44(extraout_var_x00236,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib1d");
  gl->vertexAttrib1d = (glVertexAttrib1dFunc)CONCAT44(extraout_var_x00237,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib1dv");
  gl->vertexAttrib1dv = (glVertexAttrib1dvFunc)CONCAT44(extraout_var_x00238,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib1f");
  gl->vertexAttrib1f = (glVertexAttrib1fFunc)CONCAT44(extraout_var_x00239,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib1fv");
  gl->vertexAttrib1fv = (glVertexAttrib1fvFunc)CONCAT44(extraout_var_x00240,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib1s");
  gl->vertexAttrib1s = (glVertexAttrib1sFunc)CONCAT44(extraout_var_x00241,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib1sv");
  gl->vertexAttrib1sv = (glVertexAttrib1svFunc)CONCAT44(extraout_var_x00242,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib2d");
  gl->vertexAttrib2d = (glVertexAttrib2dFunc)CONCAT44(extraout_var_x00243,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib2dv");
  gl->vertexAttrib2dv = (glVertexAttrib2dvFunc)CONCAT44(extraout_var_x00244,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib2f");
  gl->vertexAttrib2f = (glVertexAttrib2fFunc)CONCAT44(extraout_var_x00245,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib2fv");
  gl->vertexAttrib2fv = (glVertexAttrib2fvFunc)CONCAT44(extraout_var_x00246,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib2s");
  gl->vertexAttrib2s = (glVertexAttrib2sFunc)CONCAT44(extraout_var_x00247,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib2sv");
  gl->vertexAttrib2sv = (glVertexAttrib2svFunc)CONCAT44(extraout_var_x00248,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib3d");
  gl->vertexAttrib3d = (glVertexAttrib3dFunc)CONCAT44(extraout_var_x00249,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib3dv");
  gl->vertexAttrib3dv = (glVertexAttrib3dvFunc)CONCAT44(extraout_var_x00250,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib3f");
  gl->vertexAttrib3f = (glVertexAttrib3fFunc)CONCAT44(extraout_var_x00251,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib3fv");
  gl->vertexAttrib3fv = (glVertexAttrib3fvFunc)CONCAT44(extraout_var_x00252,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib3s");
  gl->vertexAttrib3s = (glVertexAttrib3sFunc)CONCAT44(extraout_var_x00253,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib3sv");
  gl->vertexAttrib3sv = (glVertexAttrib3svFunc)CONCAT44(extraout_var_x00254,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4Nbv");
  gl->vertexAttrib4Nbv = (glVertexAttrib4NbvFunc)CONCAT44(extraout_var_x00255,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4Niv");
  gl->vertexAttrib4Niv = (glVertexAttrib4NivFunc)CONCAT44(extraout_var_x00256,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4Nsv");
  gl->vertexAttrib4Nsv = (glVertexAttrib4NsvFunc)CONCAT44(extraout_var_x00257,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4Nub");
  gl->vertexAttrib4Nub = (glVertexAttrib4NubFunc)CONCAT44(extraout_var_x00258,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4Nubv");
  gl->vertexAttrib4Nubv = (glVertexAttrib4NubvFunc)CONCAT44(extraout_var_x00259,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4Nuiv");
  gl->vertexAttrib4Nuiv = (glVertexAttrib4NuivFunc)CONCAT44(extraout_var_x00260,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4Nusv");
  gl->vertexAttrib4Nusv = (glVertexAttrib4NusvFunc)CONCAT44(extraout_var_x00261,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4bv");
  gl->vertexAttrib4bv = (glVertexAttrib4bvFunc)CONCAT44(extraout_var_x00262,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4d");
  gl->vertexAttrib4d = (glVertexAttrib4dFunc)CONCAT44(extraout_var_x00263,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4dv");
  gl->vertexAttrib4dv = (glVertexAttrib4dvFunc)CONCAT44(extraout_var_x00264,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4f");
  gl->vertexAttrib4f = (glVertexAttrib4fFunc)CONCAT44(extraout_var_x00265,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4fv");
  gl->vertexAttrib4fv = (glVertexAttrib4fvFunc)CONCAT44(extraout_var_x00266,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4iv");
  gl->vertexAttrib4iv = (glVertexAttrib4ivFunc)CONCAT44(extraout_var_x00267,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4s");
  gl->vertexAttrib4s = (glVertexAttrib4sFunc)CONCAT44(extraout_var_x00268,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4sv");
  gl->vertexAttrib4sv = (glVertexAttrib4svFunc)CONCAT44(extraout_var_x00269,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4ubv");
  gl->vertexAttrib4ubv = (glVertexAttrib4ubvFunc)CONCAT44(extraout_var_x00270,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4uiv");
  gl->vertexAttrib4uiv = (glVertexAttrib4uivFunc)CONCAT44(extraout_var_x00271,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttrib4usv");
  gl->vertexAttrib4usv = (glVertexAttrib4usvFunc)CONCAT44(extraout_var_x00272,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI1i");
  gl->vertexAttribI1i = (glVertexAttribI1iFunc)CONCAT44(extraout_var_x00273,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI1iv");
  gl->vertexAttribI1iv = (glVertexAttribI1ivFunc)CONCAT44(extraout_var_x00274,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI1ui");
  gl->vertexAttribI1ui = (glVertexAttribI1uiFunc)CONCAT44(extraout_var_x00275,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI1uiv");
  gl->vertexAttribI1uiv = (glVertexAttribI1uivFunc)CONCAT44(extraout_var_x00276,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI2i");
  gl->vertexAttribI2i = (glVertexAttribI2iFunc)CONCAT44(extraout_var_x00277,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI2iv");
  gl->vertexAttribI2iv = (glVertexAttribI2ivFunc)CONCAT44(extraout_var_x00278,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI2ui");
  gl->vertexAttribI2ui = (glVertexAttribI2uiFunc)CONCAT44(extraout_var_x00279,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI2uiv");
  gl->vertexAttribI2uiv = (glVertexAttribI2uivFunc)CONCAT44(extraout_var_x00280,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI3i");
  gl->vertexAttribI3i = (glVertexAttribI3iFunc)CONCAT44(extraout_var_x00281,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI3iv");
  gl->vertexAttribI3iv = (glVertexAttribI3ivFunc)CONCAT44(extraout_var_x00282,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI3ui");
  gl->vertexAttribI3ui = (glVertexAttribI3uiFunc)CONCAT44(extraout_var_x00283,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI3uiv");
  gl->vertexAttribI3uiv = (glVertexAttribI3uivFunc)CONCAT44(extraout_var_x00284,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI4bv");
  gl->vertexAttribI4bv = (glVertexAttribI4bvFunc)CONCAT44(extraout_var_x00285,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI4i");
  gl->vertexAttribI4i = (glVertexAttribI4iFunc)CONCAT44(extraout_var_x00286,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI4iv");
  gl->vertexAttribI4iv = (glVertexAttribI4ivFunc)CONCAT44(extraout_var_x00287,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI4sv");
  gl->vertexAttribI4sv = (glVertexAttribI4svFunc)CONCAT44(extraout_var_x00288,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI4ubv");
  gl->vertexAttribI4ubv = (glVertexAttribI4ubvFunc)CONCAT44(extraout_var_x00289,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI4ui");
  gl->vertexAttribI4ui = (glVertexAttribI4uiFunc)CONCAT44(extraout_var_x00290,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI4uiv");
  gl->vertexAttribI4uiv = (glVertexAttribI4uivFunc)CONCAT44(extraout_var_x00291,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribI4usv");
  gl->vertexAttribI4usv = (glVertexAttribI4usvFunc)CONCAT44(extraout_var_x00292,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribIPointer");
  gl->vertexAttribIPointer = (glVertexAttribIPointerFunc)CONCAT44(extraout_var_x00293,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glVertexAttribPointer");
  gl->vertexAttribPointer = (glVertexAttribPointerFunc)CONCAT44(extraout_var_x00294,iVar1);
  iVar1 = (**loader->_vptr_FunctionLoader)(loader,"glViewport");
  gl->viewport = (glViewportFunc)CONCAT44(extraout_var_x00295,iVar1);
  return;
}

Assistant:

void initGL31Core (Functions* gl, const FunctionLoader* loader)
{
#include "glwInitGL31.inl"
}